

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O2

int __thiscall
gmlc::utilities::string_viewOps::trailingStringInt
          (string_viewOps *this,string_view input,int defNum)

{
  int iVar1;
  ulong uVar2;
  size_type __pos;
  string_view input_00;
  string_view input_local;
  
  input_local._M_str = (char *)input._M_len;
  if (this == (string_viewOps *)0x0) {
    return (int)input._M_str;
  }
  if ((byte)((input_local._M_str + -1)[(long)this] - 0x3aU) < 0xf6) {
    return (int)input._M_str;
  }
  input_local._M_len = (size_t)this;
  uVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    (&input_local,"0123456789",0xffffffffffffffff,10);
  if (uVar2 == 0xffffffffffffffff) {
    if (input_local._M_len < 0xb) {
      input_00._M_str = input_local._M_str;
      input_00._M_len = input_local._M_len;
      goto LAB_00346a78;
    }
    uVar2 = input_local._M_len - 10;
  }
  else if (uVar2 == input_local._M_len - 2) {
    return input_local._M_str[input_local._M_len - 1] + -0x30;
  }
  if (input_local._M_len < 0xb || input_local._M_len - 10 <= uVar2) {
    __pos = uVar2 + 1;
  }
  else {
    __pos = input_local._M_len - 9;
  }
  input_00 = (string_view)
             CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)&input_local,__pos,
                        0xffffffffffffffff);
LAB_00346a78:
  iVar1 = toIntSimple(input_00);
  return iVar1;
}

Assistant:

int trailingStringInt(std::string_view input, int defNum)
{
    if (input.empty() || (input.back() < '0' || input.back() > '9')) {
        return defNum;
    }

    auto pos1 = input.find_last_not_of(digits);
    if (pos1 == std::string_view::npos)  // in case the whole thing is a number
    {
        if (input.length() <= 10) {
            return toIntSimple(input);
        }
        pos1 = input.length() - 10;
    }
    size_t length = input.length();
    if (pos1 == length - 2) {
        return input.back() - '0';
    }
    if ((length <= 10) || (pos1 >= length - 10)) {
        return toIntSimple(input.substr(pos1 + 1));
    }
    return toIntSimple(input.substr(length - 9));
}